

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  long lVar1;
  BlockEntry *pBVar2;
  Tracks *pTVar3;
  Track **ppTVar4;
  Track *pTVar5;
  int iVar6;
  long lVar7;
  undefined4 extraout_var;
  longlong lVar8;
  Block *this_00;
  Track **ppTVar9;
  long lVar10;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  undefined4 extraout_var_00;
  
  lVar1 = cp->m_timecode;
  lVar10 = tp->m_block;
  if (lVar10 < 1) {
LAB_00156fe8:
    lVar10 = 0;
    while( true ) {
      if (this->m_entries_count <= lVar10) {
        lVar7 = Parse(this,&local_38,&local_40);
        if (lVar7 < 0) {
          return (BlockEntry *)0x0;
        }
        if (lVar7 != 0) {
          return (BlockEntry *)0x0;
        }
      }
      pBVar2 = this->m_entries[lVar10];
      iVar6 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
      this_00 = (Block *)CONCAT44(extraout_var_00,iVar6);
      if ((this_00->m_track == tp->m_track) &&
         (lVar8 = Block::GetTimeCode(this_00,this), lVar1 <= lVar8)) break;
      lVar10 = lVar10 + 1;
    }
    if ((lVar8 <= lVar1) && (-1 < tp->m_track)) {
      pTVar3 = this->m_pSegment->m_pTracks;
      ppTVar9 = pTVar3->m_trackEntries;
      ppTVar4 = pTVar3->m_trackEntriesEnd;
      if (ppTVar9 != ppTVar4) {
        while ((pTVar5 = *ppTVar9, pTVar5 == (Track *)0x0 ||
               ((pTVar5->m_info).number != tp->m_track))) {
          ppTVar9 = ppTVar9 + 1;
          if (ppTVar9 == ppTVar4) {
            return (BlockEntry *)0x0;
          }
        }
        lVar1 = (pTVar5->m_info).type;
        if (lVar1 == 1) {
          if (-1 < (char)this_00->m_flags) {
            return (BlockEntry *)0x0;
          }
          return pBVar2;
        }
        if (lVar1 == 2) {
          return pBVar2;
        }
      }
    }
  }
  else {
    do {
      if (lVar10 <= this->m_entries_count) {
        pBVar2 = this->m_entries[lVar10 + -1];
        iVar6 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
        if ((((Block *)CONCAT44(extraout_var,iVar6))->m_track == tp->m_track) &&
           (lVar8 = Block::GetTimeCode((Block *)CONCAT44(extraout_var,iVar6),this), lVar8 == lVar1))
        {
          return pBVar2;
        }
        goto LAB_00156fe8;
      }
      lVar7 = Parse(this,&local_38,&local_40);
    } while ((-1 < lVar7) && (lVar7 == 0));
  }
  return (BlockEntry *)0x0;
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}